

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

int __thiscall
axl::sl::
Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
::copy(Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
       *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  bool result;
  Ptr<void> shadow;
  undefined6 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9e;
  undefined1 in_stack_ffffffffffffff9f;
  void *in_stack_ffffffffffffffb8;
  BufHdr *in_stack_ffffffffffffffc0;
  EVP_PKEY_CTX *local_8;
  
  if (src == (EVP_PKEY_CTX *)0x0) {
    clear((Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>_>
           *)0x10e53f);
    local_8._0_4_ = 0;
  }
  else {
    rc::Ptr<void>::Ptr((Ptr<void> *)0x10e557);
    if (((Hdr *)((Ptr<void> *)this)->m_refCount != (Hdr *)0x0) &&
       (in_stack_ffffffffffffff9f =
             rc::BufHdr::isInsideBuffer(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8),
       (bool)in_stack_ffffffffffffff9f)) {
      rc::Ptr<void>::
      Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>,axl::sl::HashTableEntry<axl::sl::StringBase<char,axl::sl::StringDetailsBase<char>>,void(*)()>::GetBucketLink>>::Hdr>
                ((Ptr<void> *)this,
                 (Hdr *)CONCAT17(in_stack_ffffffffffffff9f,
                                 CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
      rc::Ptr<void>::operator=
                ((Ptr<void> *)this,
                 (Ptr<void> *)
                 CONCAT17(in_stack_ffffffffffffff9f,
                          CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
      rc::Ptr<void>::~Ptr((Ptr<void> *)0x10e5ba);
    }
    bVar1 = setCount(this,CONCAT17(in_stack_ffffffffffffff9f,
                                   CONCAT16(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98)));
    if (bVar1) {
      ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>
      ::copy((ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>,_axl::sl::HashTableEntry<axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>,_void_(*)()>::GetBucketLink>_>
              *)((Ptr<void> *)this)->m_p,dst,src);
      local_8 = src;
    }
    else {
      local_8 = (EVP_PKEY_CTX *)0xffffffffffffffff;
    }
    rc::Ptr<void>::~Ptr((Ptr<void> *)0x10e657);
  }
  return (int)local_8;
}

Assistant:

size_t
	copy(
		const T* p,
		size_t count
	) {
		if (count == 0) {
			clear();
			return 0;
		}

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			if (Details::IsSimple) {
				// for simple non-ctor-dtor types we can apply in-buffer shift

				T* end = (T*)this->m_hdr->getEnd();
				ASSERT(p + count <= end);

				this->m_p = (T*)p;
				this->m_count = count;
				return count;
			} else {
				shadow = this->m_hdr; // ensure we keep p intact
			}

		bool result = setCount(count);
		if (!result)
			return -1;

		Details::copy(this->m_p, p, count);
		return count;
	}